

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vertex_with_normal_and_texture.c
# Opt level: O2

bool_t prf_vertex_with_normal_and_texture_load_f(prf_node_t *node,prf_state_t *state,bfile_t *bfile)

{
  pool_t pool_id;
  uint uVar1;
  uint16_t uVar2;
  ushort uVar3;
  uint32_t uVar4;
  float64_t *pfVar5;
  uint len;
  bool_t bVar6;
  float32_t fVar7;
  float64_t fVar8;
  
  uVar2 = bf_get_uint16_be(bfile);
  node->opcode = uVar2;
  if (uVar2 == prf_vertex_with_normal_and_texture_info.opcode) {
    uVar2 = bf_get_uint16_be(bfile);
    node->length = uVar2;
    if (uVar2 < 0x20) {
      prf_error(6,"vertex with normal and texture too short (%d bytes).");
      return 0;
    }
    pfVar5 = (float64_t *)node->data;
    if (pfVar5 == (float64_t *)0x0) {
      pool_id = state->model->mempool_id;
      if (pool_id == 0) {
        pfVar5 = (float64_t *)malloc((ulong)(uVar2 - 4));
      }
      else {
        pfVar5 = (float64_t *)pool_malloc(pool_id,uVar2 - 4);
      }
      node->data = (uint8_t *)pfVar5;
      if (pfVar5 == (float64_t *)0x0) {
        prf_error(9,"memory allocation problem (returned NULL)");
        uVar1 = 8;
        goto LAB_0010cf0f;
      }
    }
    uVar2 = bf_get_uint16_be(bfile);
    *(uint16_t *)(pfVar5 + 3) = uVar2;
    uVar2 = bf_get_uint16_be(bfile);
    *(uint16_t *)((long)pfVar5 + 0x1a) = uVar2;
    fVar8 = bf_get_float64_be(bfile);
    *pfVar5 = fVar8;
    fVar8 = bf_get_float64_be(bfile);
    pfVar5[1] = fVar8;
    fVar8 = bf_get_float64_be(bfile);
    pfVar5[2] = fVar8;
    uVar3 = node->length;
    if (uVar3 < 0x24) {
      uVar1 = 0x20;
    }
    else {
      fVar7 = bf_get_float32_be(bfile);
      *(float32_t *)((long)pfVar5 + 0x1c) = fVar7;
      uVar3 = node->length;
      if (uVar3 < 0x28) {
        uVar1 = 0x24;
      }
      else {
        fVar7 = bf_get_float32_be(bfile);
        *(float32_t *)(pfVar5 + 4) = fVar7;
        uVar3 = node->length;
        if (uVar3 < 0x2c) {
          uVar1 = 0x28;
        }
        else {
          fVar7 = bf_get_float32_be(bfile);
          *(float32_t *)((long)pfVar5 + 0x24) = fVar7;
          uVar3 = node->length;
          if (uVar3 < 0x30) {
            uVar1 = 0x2c;
          }
          else {
            fVar7 = bf_get_float32_be(bfile);
            *(float32_t *)(pfVar5 + 5) = fVar7;
            uVar3 = node->length;
            if (uVar3 < 0x34) {
              uVar1 = 0x30;
            }
            else {
              fVar7 = bf_get_float32_be(bfile);
              *(float32_t *)((long)pfVar5 + 0x2c) = fVar7;
              uVar3 = node->length;
              if (uVar3 < 0x38) {
                uVar1 = 0x34;
              }
              else {
                uVar4 = bf_get_uint32_be(bfile);
                *(uint32_t *)(pfVar5 + 6) = uVar4;
                uVar3 = node->length;
                if (uVar3 < 0x3c) {
                  uVar1 = 0x38;
                }
                else {
                  uVar4 = bf_get_uint32_be(bfile);
                  *(uint32_t *)((long)pfVar5 + 0x34) = uVar4;
                  uVar3 = node->length;
                  uVar1 = 0x3c;
                }
              }
            }
          }
        }
      }
    }
    bVar6 = 1;
    len = uVar3 - uVar1;
    if (uVar1 <= uVar3 && len != 0) {
      bf_read(bfile,node->data + ((ulong)uVar1 - 4),len);
    }
  }
  else {
    prf_error(9,"tried vertex with normal and texture load method on node of type %d",(ulong)uVar2);
    uVar1 = 2;
LAB_0010cf0f:
    bVar6 = 0;
    bf_rewind(bfile,uVar1);
  }
  return bVar6;
}

Assistant:

static
bool_t
prf_vertex_with_normal_and_texture_load_f(
    prf_node_t * node,
    prf_state_t * state,
    bfile_t * bfile )
{
    int pos;

    assert( node != NULL && state != NULL && bfile != NULL );

    node->opcode = bf_get_uint16_be( bfile );
    if ( node->opcode != prf_vertex_with_normal_and_texture_info.opcode ) {
        prf_error( 9,
          "tried vertex with normal and texture load method on node of type %d",
          node->opcode );
        bf_rewind( bfile, 2 );
        return FALSE;
    }

    node->length = bf_get_uint16_be( bfile );
    if ( node->length < 32 ) {
        prf_error( 6, "vertex with normal and texture too short (%d bytes).",
            node->length );
        return FALSE;
    }

    if ( node->length > 4 && node->data == NULL ) { /* not preallocated */
        assert( state->model != NULL );
        if ( state->model->mempool_id == 0 )
            node->data = (uint8_t *)malloc( node->length - 4 + NODE_DATA_PAD );
        else
            node->data = (uint8_t *)pool_malloc( state->model->mempool_id,
                node->length - 4 + NODE_DATA_PAD );
        if ( node->data == NULL ) {
            prf_error( 9, "memory allocation problem (returned NULL)" );
            bf_rewind( bfile, 8 );
            return FALSE;
        }
    }

    pos = 4;
    do {
        node_data * data;
        data = (node_data *) node->data;
        data->color_name_index = bf_get_uint16_be( bfile ); pos += 2;
        data->flags = bf_get_uint16_be( bfile ); pos += 2;
        prf_dblwrite( data->x, bf_get_float64_be( bfile ) ); pos += 8;
        prf_dblwrite( data->y, bf_get_float64_be( bfile ) ); pos += 8;
        prf_dblwrite( data->z, bf_get_float64_be( bfile ) ); pos += 8;
        if ( node->length < (pos + 4) ) break;
        data->normal[0] = bf_get_float32_be( bfile ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        data->normal[1] = bf_get_float32_be( bfile ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        data->normal[2] = bf_get_float32_be( bfile ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        data->texture[0] = bf_get_float32_be( bfile ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        data->texture[1] = bf_get_float32_be( bfile ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        data->packed_color = bf_get_uint32_be( bfile ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        data->color_index = bf_get_uint32_be( bfile ); pos += 4;
    } while ( FALSE );

    if ( node->length > pos )
        pos += bf_read( bfile, node->data + pos - 4 + NODE_DATA_PAD,
            node->length - pos );

    return TRUE;
}